

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O3

void __thiscall EventDispatcher::sendEventSync(EventDispatcher *this,Event *ev)

{
  int *piVar1;
  Mutex *this_00;
  int iVar2;
  SyncEventHolder holder;
  Event local_50;
  SmartPtr<Event> local_38;
  char local_30;
  
  local_50.mPriority = ev->mPriority;
  local_50.super_RefCount.mRefCount = 0;
  local_50.super_RefCount._12_4_ = 0xfffffffd;
  local_50.super_RefCount._vptr_RefCount = (_func_int **)&PTR_onRefCountZero_0012fee0;
  local_38.mObj = ev;
  pthread_mutex_lock((pthread_mutex_t *)&Mutex::mCriticalSection);
  piVar1 = &(ev->super_RefCount).mRefCount;
  *piVar1 = *piVar1 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&Mutex::mCriticalSection);
  local_30 = '\0';
  EventQueue::SendEvent(&this->mQueue,&local_50);
  (*(this->super_IEventDispatcher)._vptr_IEventDispatcher[0xc])(this);
  iVar2 = (*(this->super_IEventDispatcher)._vptr_IEventDispatcher[7])(this);
  if ((char)iVar2 != '\0') {
    jh_log_print(1,"virtual void EventDispatcher::sendEventSync(Event *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                 ,0xa3,"Sending sync event to your current thread, I will die now...");
  }
  this_00 = &this->mSyncLock;
  Mutex::Lock(this_00);
  while (local_30 == '\0') {
    Condition::Wait(&this->mSyncWait,this_00);
  }
  Mutex::Unlock(this_00);
  local_50.super_RefCount._vptr_RefCount = (_func_int **)&PTR_onRefCountZero_0012fee0;
  SmartPtr<Event>::~SmartPtr(&local_38);
  return;
}

Assistant:

void EventDispatcher::sendEventSync( Event *ev )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	// event ref count handled by holder.
	SyncEventHolder holder( ev );

	mQueue.SendEvent( &holder );
	wakeThread();
	
	if (isThreadCurrent())
		LOG_ERR_FATAL("Sending sync event to your current thread, I will die now...");
	
	mSyncLock.Lock();
	while ( holder.mDone == false )
		mSyncWait.Wait( mSyncLock );
	mSyncLock.Unlock();
}